

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall
ON__LayerPerViewSettings::CopySettings
          (ON__LayerPerViewSettings *this,ON__LayerPerViewSettings *src,uint settings_mask)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  uint settings_mask_local;
  ON__LayerPerViewSettings *src_local;
  ON__LayerPerViewSettings *this_local;
  
  if (((src != (ON__LayerPerViewSettings *)0x0) && (this != src)) && (settings_mask != 0)) {
    if ((settings_mask & 1) != 0) {
      uVar1 = (src->m_viewport_id).Data2;
      uVar2 = (src->m_viewport_id).Data3;
      (this->m_viewport_id).Data1 = (src->m_viewport_id).Data1;
      (this->m_viewport_id).Data2 = uVar1;
      (this->m_viewport_id).Data3 = uVar2;
      *(undefined8 *)(this->m_viewport_id).Data4 = *(undefined8 *)(src->m_viewport_id).Data4;
    }
    if ((settings_mask & 2) != 0) {
      (this->m_color).field_0 = (src->m_color).field_0;
    }
    if ((settings_mask & 4) != 0) {
      (this->m_plot_color).field_0 = (src->m_plot_color).field_0;
    }
    if ((settings_mask & 8) != 0) {
      this->m_plot_weight_mm = src->m_plot_weight_mm;
    }
    if ((settings_mask & 0x10) != 0) {
      this->m_visible = src->m_visible;
    }
    if ((settings_mask & 0x20) != 0) {
      this->m_persistent_visibility = src->m_persistent_visibility;
    }
  }
  return;
}

Assistant:

void ON__LayerPerViewSettings::CopySettings( const ON__LayerPerViewSettings* src, unsigned int settings_mask )
{
  if ( 0 != src && this != src && 0 != settings_mask )
  {
    if ( 0 != (settings_mask & ON_Layer::per_viewport_id) )
      m_viewport_id = src->m_viewport_id;
    if ( 0 != (settings_mask & ON_Layer::per_viewport_color) )
      m_color = src->m_color;
    if ( 0 != (settings_mask & ON_Layer::per_viewport_plot_color) )
      m_plot_color = src->m_plot_color;
    if ( 0 != (settings_mask & ON_Layer::per_viewport_plot_weight) )
      m_plot_weight_mm = src->m_plot_weight_mm;
    if ( 0 != (settings_mask & ON_Layer::per_viewport_visible) )
      m_visible = src->m_visible;
    if ( 0 != (settings_mask & ON_Layer::per_viewport_persistent_visibility) )
      m_persistent_visibility = src->m_persistent_visibility;
  }
}